

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

int ImPlot::LabelAxisValue
              (ImPlotAxis *axis,ImPlotTickCollection *ticks,double value,char *buff,int size)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ImPlotPlot *pIVar3;
  uint uVar4;
  ImPlotContext *pIVar5;
  int i;
  int iVar6;
  ulong uVar7;
  ImPlotTick *pIVar8;
  double *pdVar9;
  ImPlotTick *pIVar10;
  undefined4 in_R9D;
  ulong uVar11;
  double dVar12;
  ImPlotDateTimeFmt fmt;
  long local_38;
  int local_30;
  
  pIVar5 = GImPlot;
  if ((axis->Flags & 0x40) == 0) {
    if (ticks->Size < 2) {
      pIVar8 = (ImPlotTick *)&axis->Range;
      pIVar10 = (ImPlotTick *)&(axis->Range).Max;
    }
    else {
      if ((ticks->Ticks).Size < 2) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68c,"const T &ImVector<ImPlotTick>::operator[](int) const [T = ImPlotTick]"
                     );
      }
      pIVar8 = (ticks->Ticks).Data;
      pIVar10 = pIVar8 + 1;
    }
    dVar12 = pIVar10->PlotPos - pIVar8->PlotPos;
    iVar6 = 0;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      dVar12 = log10(ABS(dVar12));
      dVar12 = floor(dVar12);
      iVar6 = (int)dVar12;
    }
    uVar4 = 1 - iVar6;
    if (0 < iVar6) {
      uVar4 = 0;
    }
    iVar6 = snprintf(buff,(long)size,"%.*f",value,(ulong)uVar4);
    return iVar6;
  }
  dVar12 = (axis->Range).Max - (axis->Range).Min;
  pIVar3 = GImPlot->CurrentPlot;
  if (axis->Orientation == 0) {
    pdVar9 = (double *)&GetUnitForRange(double)::cutoffs;
    uVar7 = 0;
    do {
      if (dVar12 / (double)(((pIVar3->PlotRect).Max.x - (pIVar3->PlotRect).Min.x) / 100.0) <=
          *pdVar9) goto LAB_001b105e;
      uVar7 = uVar7 + 1;
      pdVar9 = pdVar9 + 1;
    } while (uVar7 != 8);
  }
  else {
    pdVar9 = (double *)&GetUnitForRange(double)::cutoffs;
    uVar7 = 0;
    do {
      if (dVar12 / (double)(((pIVar3->PlotRect).Max.y - (pIVar3->PlotRect).Min.y) / 100.0) <=
          *pdVar9) goto LAB_001b105e;
      uVar7 = uVar7 + 1;
      pdVar9 = pdVar9 + 1;
    } while (uVar7 != 8);
  }
  uVar7 = 8;
LAB_001b105e:
  uVar11 = 7;
  if ((uint)uVar7 < 7) {
    uVar11 = uVar7 & 0xffffffff;
  }
  dVar12 = floor(value);
  local_30 = (int)(value * 1000000.0 + dVar12 * -1000000.0);
  local_38 = (long)value + (long)(local_30 / 1000000);
  local_30 = local_30 % 1000000;
  uVar1 = (pIVar5->Style).UseISO8601;
  uVar2 = (pIVar5->Style).Use24HourClock;
  fmt.Date._1_1_ = uVar2;
  fmt.Date._0_1_ = uVar1;
  fmt._2_6_ = 0;
  fmt.UseISO8601 = (bool)(char)in_R9D;
  fmt.Use24HourClock = (bool)(char)((uint)in_R9D >> 8);
  fmt._10_2_ = (short)((uint)in_R9D >> 0x10);
  iVar6 = FormatDateTime((ImPlot *)&local_38,(ImPlotTime *)buff,(char *)(ulong)(uint)size,
                         (int)*(undefined8 *)((long)&TimeFormatMouseCursor + uVar11 * 0xc),fmt);
  return iVar6;
}

Assistant:

int LabelAxisValue(const ImPlotAxis& axis, const ImPlotTickCollection& ticks, double value, char* buff, int size) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(axis.Flags, ImPlotAxisFlags_Time)) {
        ImPlotTimeUnit unit = (axis.Orientation == ImPlotOrientation_Horizontal)
                            ? GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetWidth() / 100))
                            : GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetHeight() / 100));
        return FormatDateTime(ImPlotTime::FromDouble(value), buff, size, GetDateTimeFmt(TimeFormatMouseCursor, unit));
    }
    else {
        double range = ticks.Size > 1 ? (ticks.Ticks[1].PlotPos - ticks.Ticks[0].PlotPos) : axis.Range.Size();
        return snprintf(buff, size, "%.*f", Precision(range), value);
    }
}